

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_common.hpp
# Opt level: O0

void Catch::throwLogicError(string *message,SourceLineInfo *locationInfo)

{
  bool bVar1;
  ostream *poVar2;
  logic_error *this;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream oss;
  SourceLineInfo *locationInfo_local;
  string *message_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = operator<<((ostream *)local_190,locationInfo);
  poVar2 = std::operator<<(poVar2,": Internal Catch error: \'");
  poVar2 = std::operator<<(poVar2,(string *)message);
  std::operator<<(poVar2,"\'");
  bVar1 = alwaysTrue();
  if (!bVar1) {
    std::__cxx11::ostringstream::~ostringstream(local_190);
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::logic_error::logic_error(this,local_1c0);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void throwLogicError( std::string const& message, SourceLineInfo const& locationInfo ) {
        std::ostringstream oss;
        oss << locationInfo << ": Internal Catch error: '" << message << "'";
        if( alwaysTrue() )
            throw std::logic_error( oss.str() );
    }